

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfArray.h
# Opt level: O2

void __thiscall Imf_3_4::Array2D<void_*>::resizeErase(Array2D<void_*> *this,long sizeX,long sizeY)

{
  void **ppvVar1;
  
  ppvVar1 = (void **)operator_new__(-(ulong)((ulong)(sizeY * sizeX) >> 0x3d != 0) |
                                    sizeY * sizeX * 8);
  if (this->_data != (void **)0x0) {
    operator_delete__(this->_data);
  }
  this->_sizeX = sizeX;
  this->_sizeY = sizeY;
  this->_data = ppvVar1;
  return;
}

Assistant:

inline void
Array2D<T>::resizeErase (long sizeX, long sizeY)
{
    T* tmp = new T[sizeX * sizeY];
    delete[] _data;
    _sizeX = sizeX;
    _sizeY = sizeY;
    _data  = tmp;
}